

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O2

void helics::CoreFactory::addExtraTypes(string *name,CoreType type)

{
  CoreType CStack_8;
  
  if (type == INPROC) {
    CStack_8 = TEST;
  }
  else if (type == INTERPROCESS) {
    CStack_8 = IPC;
  }
  else if (type == IPC) {
    CStack_8 = INTERPROCESS;
  }
  else {
    if (type != TEST) {
      return;
    }
    CStack_8 = INPROC;
  }
  gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::addType
            ((SearchableObjectHolder<helics::Core,_helics::CoreType> *)searchableCores,name,CStack_8
            );
  return;
}

Assistant:

static void addExtraTypes(const std::string& name, CoreType type)
{
    switch (type) {
        case CoreType::INPROC:
            searchableCores.addType(name, CoreType::TEST);
            break;
        case CoreType::TEST:
            searchableCores.addType(name, CoreType::INPROC);
            break;
        case CoreType::IPC:
            searchableCores.addType(name, CoreType::INTERPROCESS);
            break;
        case CoreType::INTERPROCESS:
            searchableCores.addType(name, CoreType::IPC);
            break;
        default:
            break;
    }
}